

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

token * dup_token(dmr_C *C,token *token,position *streampos)

{
  position pVar1;
  token *ptVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  ptVar2 = alloc_token(C,streampos);
  uVar3 = (ulong)(SUB84(token->pos,0) & 0x3f);
  pVar1 = ptVar2->pos;
  ptVar2->pos = (position)((ulong)pVar1 & 0xffffffffffffffc0 | uVar3);
  uVar4 = (ulong)(SUB84(token->pos,0) & 0x100000);
  ptVar2->pos = (position)((ulong)pVar1 & 0xffffffffffefffc0 | uVar3 | uVar4);
  uVar5 = (ulong)(SUB84(token->pos,0) & 0x200000);
  ptVar2->pos = (position)((ulong)pVar1 & 0xffffffffffcfffc0 | uVar3 | uVar4 | uVar5);
  ptVar2->field_2 = token->field_2;
  ptVar2->pos = (position)
                ((ulong)pVar1 & 0x7fffffffffcfffc0 | uVar3 | uVar4 | uVar5 |
                (ulong)token->pos & 0x8000000000000000);
  return ptVar2;
}

Assistant:

static struct token *dup_token(struct dmr_C *C, struct token *token, struct position *streampos)
{
	struct token *alloc = alloc_token(C, streampos);
	dmrC_token_type(alloc) = dmrC_token_type(token);
	alloc->pos.newline = token->pos.newline;
	alloc->pos.whitespace = token->pos.whitespace;
	alloc->number = token->number;
	alloc->pos.noexpand = token->pos.noexpand;
	return alloc;	
}